

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,MOJOSHADER_symbolTypeInfo *src,
                   MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  MOJOSHADER_symbolType MVar2;
  uint uVar3;
  MOJOSHADER_symbolStructMember *pMVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  MOJOSHADER_symbolStructMember *pMVar9;
  
  MVar2 = src->parameter_type;
  uVar1 = src->rows;
  uVar3 = src->columns;
  dst->parameter_class = src->parameter_class;
  dst->parameter_type = MVar2;
  dst->rows = uVar1;
  dst->columns = uVar3;
  dst->elements = src->elements;
  uVar1 = src->member_count;
  dst->member_count = uVar1;
  if (uVar1 != 0) {
    pMVar4 = (MOJOSHADER_symbolStructMember *)(*m)(uVar1 * 0x28,d);
    dst->members = pMVar4;
    lVar8 = 8;
    for (uVar7 = 0; uVar7 < dst->member_count; uVar7 = uVar7 + 1) {
      pMVar4 = src->members;
      pcVar6 = *(char **)((long)pMVar4 + lVar8 + -8);
      if (pcVar6 == (char *)0x0) {
        pMVar9 = dst->members;
      }
      else {
        sVar5 = strlen(pcVar6);
        pcVar6 = (char *)(*m)((int)sVar5 + 1,d);
        strcpy(pcVar6,*(char **)((long)src->members + lVar8 + -8));
        pMVar9 = dst->members;
        *(char **)((long)pMVar9 + lVar8 + -8) = pcVar6;
        pMVar4 = src->members;
      }
      copysymbolinfo((MOJOSHADER_symbolTypeInfo *)((long)&pMVar9->name + lVar8),
                     (MOJOSHADER_symbolTypeInfo *)((long)&pMVar4->name + lVar8),m,d);
      lVar8 = lVar8 + 0x28;
    }
  }
  return;
}

Assistant:

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,
                    MOJOSHADER_symbolTypeInfo *src,
                    MOJOSHADER_malloc m,
                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;

    dst->parameter_class = src->parameter_class;
    dst->parameter_type = src->parameter_type;
    dst->rows = src->rows;
    dst->columns = src->columns;
    dst->elements = src->elements;
    dst->member_count = src->member_count;

    if (dst->member_count > 0)
    {
        siz = sizeof (MOJOSHADER_symbolStructMember) * dst->member_count;
        dst->members = (MOJOSHADER_symbolStructMember *) m(siz, d);
        // !!! FIXME: Out of memory check!
        for (i = 0; i < dst->member_count; i++)
        {
            if (src->members[i].name != NULL)
            {
                siz = strlen(src->members[i].name) + 1;
                stringcopy = (char *) m(siz, d);
                strcpy(stringcopy, src->members[i].name);
                dst->members[i].name = stringcopy;
            } // if
            copysymbolinfo(&dst->members[i].info, &src->members[i].info, m, d);
        } // for
    } // if
}